

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawLoader.cpp
# Opt level: O2

void __thiscall
Assimp::RAWImporter::InternReadFile
          (RAWImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *this_00;
  aiNode **ppaVar1;
  byte bVar2;
  char cVar3;
  pointer pMVar4;
  char *pcVar5;
  pointer pGVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  Logger *this_01;
  ulong uVar9;
  aiNode *paVar10;
  aiMesh **ppaVar11;
  aiMaterial **ppaVar12;
  aiMesh *this_02;
  aiVector3D *__s;
  aiColor4D *__s_00;
  ulong *puVar13;
  uint *puVar14;
  aiMaterial *this_03;
  DeadlyImportError *pDVar15;
  pointer pGVar16;
  aiFace *paVar17;
  uint uVar18;
  long lVar19;
  vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
  *pvVar20;
  ulong uVar21;
  pointer pMVar22;
  MeshInformation *mesh;
  string *_name;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar23;
  aiFace *f;
  ulong uVar24;
  aiFace *paVar25;
  char *sz;
  aiScene *local_1518;
  vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
  *local_1510;
  float data [12];
  aiNode **local_14d8;
  vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
  outGroups;
  undefined1 local_14b0 [16];
  char local_14a0 [16];
  IOStream *local_1490;
  aiMaterial **local_1488;
  uint *local_1480;
  pointer local_1478;
  pointer local_1470;
  pointer local_1468;
  char *buffer;
  vector<char,_std::allocator<char>_> mBuffer2;
  aiString s;
  char line [4096];
  IOStream *stream;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)line,"rb",(allocator<char> *)&s);
  iVar8 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,line._0_8_);
  stream = (IOStream *)CONCAT44(extraout_var,iVar8);
  std::__cxx11::string::~string((string *)line);
  if (stream == (IOStream *)0x0) {
    pDVar15 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                   "Failed to open RAW file ",pFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)line,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,".");
    DeadlyImportError::DeadlyImportError(pDVar15,(string *)line);
    __cxa_throw(pDVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1490 = stream;
  BaseImporter::TextFileToBuffer(stream,&mBuffer2,FORBID_EMPTY);
  buffer = mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"<default>",(allocator<char> *)data);
  GroupInformation::GroupInformation((GroupInformation *)line,(string *)&s);
  std::
  vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
  ::vector(&outGroups,1,(GroupInformation *)line,(allocator_type *)local_14b0);
  GroupInformation::~GroupInformation((GroupInformation *)line);
  std::__cxx11::string::~string((string *)&s);
  pGVar16 = outGroups.
            super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1518 = pScene;
LAB_00539d69:
  do {
    do {
      _name = (string *)data;
      bVar7 = GetNextLine<char>(&buffer,line);
      if (!bVar7) {
        paVar10 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar10);
        ppaVar1 = &pScene->mRootNode;
        pScene->mRootNode = paVar10;
        aiString::Set((aiString *)paVar10,"<RawRoot>");
        for (pGVar16 = outGroups.
                       super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pGVar16 !=
            outGroups.
            super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
            ._M_impl.super__Vector_impl_data._M_finish; pGVar16 = pGVar16 + 1) {
          if ((pGVar16->meshes).
              super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pGVar16->meshes).
              super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            puVar14 = &pScene->mRootNode->mNumChildren;
            *puVar14 = *puVar14 + 1;
            pScene->mNumMeshes =
                 pScene->mNumMeshes +
                 (int)(((long)(pGVar16->meshes).
                              super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pGVar16->meshes).
                             super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x50);
          }
        }
        if ((ulong)pScene->mNumMeshes == 0) {
          pDVar15 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&s,"RAW: No meshes loaded. The file seems to be corrupt or empty.",
                     (allocator<char> *)data);
          DeadlyImportError::DeadlyImportError(pDVar15,(string *)&s);
          __cxa_throw(pDVar15,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        ppaVar11 = (aiMesh **)operator_new__((ulong)pScene->mNumMeshes << 3);
        pScene->mMeshes = ppaVar11;
        paVar10 = pScene->mRootNode;
        if ((ulong)paVar10->mNumChildren == 1) {
          paVar10->mNumChildren = 0;
          local_14d8 = ppaVar1;
        }
        else {
          local_14d8 = (aiNode **)operator_new__((ulong)paVar10->mNumChildren << 3);
          memset(local_14d8,0,(ulong)paVar10->mNumChildren << 3);
          paVar10->mChildren = local_14d8;
        }
        local_1478 = outGroups.
                     super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        pScene->mNumMaterials = pScene->mNumMeshes;
        ppaVar12 = (aiMaterial **)operator_new__((ulong)pScene->mNumMeshes << 3);
        pScene->mMaterials = ppaVar12;
        pvVar20 = (vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                   *)0x0;
        pGVar16 = outGroups.
                  super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (pGVar16 == local_1478) {
            std::
            vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
            ::~vector(&outGroups);
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                      (&mBuffer2.super__Vector_base<char,_std::allocator<char>_>);
            (*local_1490->_vptr_IOStream[1])();
            return;
          }
          if ((pGVar16->meshes).
              super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pGVar16->meshes).
              super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            if ((*ppaVar1)->mNumChildren == 0) {
              paVar10 = *local_14d8;
            }
            else {
              paVar10 = (aiNode *)operator_new(0x478);
              aiNode::aiNode(paVar10);
              *local_14d8 = paVar10;
              paVar10->mParent = *ppaVar1;
            }
            uVar9 = (pGVar16->name)._M_string_length;
            if (uVar9 < 0x400) {
              (paVar10->mName).length = (ai_uint32)uVar9;
              memcpy((paVar10->mName).data,(pGVar16->name)._M_dataplus._M_p,uVar9);
              (paVar10->mName).data[uVar9] = '\0';
            }
            uVar9 = ((long)(pGVar16->meshes).
                           super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pGVar16->meshes).
                          super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x50;
            paVar10->mNumMeshes = (uint)uVar9;
            local_1480 = (uint *)operator_new__((uVar9 & 0xffffffff) << 2);
            paVar10->mMeshes = local_1480;
            local_1468 = (pGVar16->meshes).
                         super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            local_1470 = pGVar16;
            for (pMVar22 = (pGVar16->meshes).
                           super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                           ._M_impl.super__Vector_impl_data._M_start; pGVar16 = local_1470,
                pMVar22 != local_1468; pMVar22 = pMVar22 + 1) {
              if ((pMVar22->vertices).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start ==
                  (pMVar22->vertices).
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish) {
                __assert_fail("!(*it2).vertices.empty()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Raw/RawLoader.cpp"
                              ,0x114,
                              "virtual void Assimp::RAWImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                             );
              }
              *local_1480 = (uint)pvVar20;
              local_1510 = pvVar20;
              local_1488 = ppaVar12;
              this_02 = (aiMesh *)operator_new(0x520);
              aiMesh::aiMesh(this_02);
              local_1518->mMeshes[(ulong)local_1510 & 0xffffffff] = this_02;
              this_02->mMaterialIndex = (uint)local_1510;
              this_02->mPrimitiveTypes = 4;
              uVar9 = ((long)(pMVar22->vertices).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pMVar22->vertices).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xc;
              uVar18 = (uint)uVar9;
              this_02->mNumVertices = uVar18;
              uVar24 = uVar9 & 0xffffffff;
              uVar21 = uVar24 * 0xc;
              __s = (aiVector3D *)operator_new__(uVar21);
              if (uVar24 != 0) {
                memset(__s,0,((uVar21 - 0xc) - (uVar21 - 0xc) % 0xc) + 0xc);
              }
              this_02->mVertices = __s;
              memcpy(__s,(pMVar22->vertices).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start,uVar21);
              lVar19 = (long)(pMVar22->colors).
                             super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pMVar22->colors).
                             super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              if (lVar19 != 0) {
                if (lVar19 >> 4 != uVar24) {
                  __assert_fail("(*it2).colors.size() == mesh->mNumVertices",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Raw/RawLoader.cpp"
                                ,0x124,
                                "virtual void Assimp::RAWImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                               );
                }
                __s_00 = (aiColor4D *)operator_new__(uVar24 << 4);
                if (uVar18 != 0) {
                  memset(__s_00,0,uVar24 << 4);
                }
                this_02->mColors[0] = __s_00;
                memcpy(__s_00,(pMVar22->colors).
                              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,(uVar9 & 0xffffffff) << 4);
              }
              uVar21 = (uVar9 & 0xffffffff) / 3;
              if ((int)((uVar9 & 0xffffffff) % 3) != 0) {
                __assert_fail("0 == mesh->mNumVertices % 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Raw/RawLoader.cpp"
                              ,299,
                              "virtual void Assimp::RAWImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                             );
              }
              this_02->mNumFaces = (uint)uVar21;
              puVar13 = (ulong *)operator_new__(uVar21 * 0x10 + 8);
              *puVar13 = uVar21;
              paVar25 = (aiFace *)(puVar13 + 1);
              if (2 < uVar18) {
                paVar17 = paVar25;
                do {
                  paVar17->mNumIndices = 0;
                  paVar17->mIndices = (uint *)0x0;
                  paVar17 = paVar17 + 1;
                } while (paVar17 != paVar25 + uVar21);
              }
              local_1480 = local_1480 + 1;
              pvVar20 = (vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                         *)(ulong)((int)local_1510 + 1);
              this_02->mFaces = paVar25;
              iVar8 = 0;
              paVar17 = paVar25;
              while (paVar17 != paVar25 + uVar21) {
                paVar17->mNumIndices = 3;
                puVar14 = (uint *)operator_new__(0xc);
                paVar17->mIndices = puVar14;
                for (lVar19 = 0; lVar19 != 3; lVar19 = lVar19 + 1) {
                  paVar17->mIndices[lVar19] = iVar8 + (int)lVar19;
                }
                iVar8 = iVar8 + 3;
                paVar17 = paVar17 + 1;
              }
              this_03 = (aiMaterial *)operator_new(0x10);
              aiMaterial::aiMaterial(this_03);
              data[0] = 1.0;
              data[1] = 1.0;
              data[2] = 1.0;
              data[3] = 1.0;
              bVar7 = std::operator==("%default%",&pMVar22->name);
              ppaVar12 = local_1488;
              if (bVar7) {
                data[2] = 0.6;
                data[0] = 0.6;
                data[1] = 0.6;
              }
              else if ((pMVar22->name)._M_string_length != 0) {
                s._0_8_ = s._0_8_ & 0xffffff0000000000;
                memset(s.data + 1,0x1b,0x3ff);
                uVar9 = (pMVar22->name)._M_string_length;
                if (uVar9 < 0x400) {
                  s.length = (ai_uint32)uVar9;
                  memcpy(s.data,(pMVar22->name)._M_dataplus._M_p,uVar9);
                  s.data[uVar9] = '\0';
                }
                aiMaterial::AddProperty(this_03,&s,"$tex.file",1,0);
              }
              aiMaterial::AddProperty<aiColor4t<float>>
                        (this_03,(aiColor4D *)data,1,"$clr.diffuse",0,0);
              *ppaVar12 = this_03;
              ppaVar12 = ppaVar12 + 1;
            }
          }
          pGVar16 = pGVar16 + 1;
        } while( true );
      }
      sz = line;
      SkipSpaces<char>(&sz);
      pGVar6 = outGroups.
               super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pcVar5 = sz;
      bVar2 = *sz;
    } while ((bVar2 < 0xe) && ((0x3401U >> (bVar2 & 0x1f) & 1) != 0));
    if ((9 < (byte)(bVar2 - 0x30)) && ((bVar2 != 0x2b && (bVar2 != 0x2d)))) {
      uVar9 = 0;
      while ((0x20 < bVar2 || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))) {
        bVar2 = sz[uVar9 + 1];
        uVar9 = uVar9 + 1;
      }
      for (pGVar16 = outGroups.
                     super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                     ._M_impl.super__Vector_impl_data._M_start; pGVar16 != pGVar6;
          pGVar16 = pGVar16 + 1) {
        if (((uVar9 & 0xffffffff) == (pGVar16->name)._M_string_length) &&
           (iVar8 = strcmp(pcVar5,(pGVar16->name)._M_dataplus._M_p), iVar8 == 0)) goto LAB_00539d69;
      }
      data._0_8_ = data + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)_name,pcVar5,pcVar5 + (uVar9 & 0xffffffff));
      GroupInformation::GroupInformation((GroupInformation *)&s,_name);
      std::
      vector<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
      ::emplace_back<Assimp::RAWImporter::GroupInformation>(&outGroups,(GroupInformation *)&s);
      GroupInformation::~GroupInformation((GroupInformation *)&s);
      std::__cxx11::string::~string((string *)_name);
      pGVar16 = outGroups.
                super__Vector_base<Assimp::RAWImporter::GroupInformation,_std::allocator<Assimp::RAWImporter::GroupInformation>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      goto LAB_00539d69;
    }
    for (lVar19 = 0; lVar19 != 0xc; lVar19 = lVar19 + 1) {
      bVar7 = SkipSpaces<char>(&sz);
      if ((!bVar7) ||
         (((cVar3 = *sz, 9 < (byte)(cVar3 - 0x30U) && (cVar3 != '+')) && (cVar3 != '-')))) {
        if (((int)lVar19 == 0xc) || ((int)lVar19 == 9)) goto LAB_00539e34;
        this_01 = DefaultLogger::get();
        Logger::error(this_01,"A line may have either 9 or 12 floats and an optional texture");
        goto LAB_00539d69;
      }
      sz = fast_atoreal_move<float>(sz,(float *)_name,true);
      _name = (string *)((long)&(_name->_M_dataplus)._M_p + 4);
    }
    lVar19 = 0xc;
LAB_00539e34:
    bVar2 = *sz;
    if ((bVar2 < 0xe) && ((0x3401U >> (bVar2 & 0x1f) & 1) != 0)) {
      if ((int)lVar19 == 9) {
        sz = "%default%";
        uVar9 = 9;
      }
      else {
        sz = "";
        uVar9 = 0;
      }
    }
    else {
      uVar9 = 0;
      while ((0x20 < bVar2 || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))) {
        bVar2 = sz[uVar9 + 1];
        uVar9 = uVar9 + 1;
      }
    }
    pcVar5 = sz;
    local_1510 = &pGVar16->meshes;
    pMVar4 = (pGVar16->meshes).
             super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar9 = uVar9 & 0xffffffff;
    for (pMVar22 = (pGVar16->meshes).
                   super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
                   ._M_impl.super__Vector_impl_data._M_start; pMVar22 != pMVar4;
        pMVar22 = pMVar22 + 1) {
      if (((pMVar22->name)._M_string_length == uVar9) &&
         ((pScene = local_1518, uVar9 == 0 ||
          (iVar8 = strcmp(pcVar5,(pMVar22->name)._M_dataplus._M_p), pScene = local_1518, iVar8 == 0)
          ))) goto LAB_00539f33;
    }
    local_14b0._0_8_ = local_14a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_14b0,pcVar5,pcVar5 + uVar9);
    MeshInformation::MeshInformation((MeshInformation *)&s,(string *)local_14b0);
    pScene = local_1518;
    std::
    vector<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
    ::emplace_back<Assimp::RAWImporter::MeshInformation>(local_1510,(MeshInformation *)&s);
    MeshInformation::~MeshInformation((MeshInformation *)&s);
    std::__cxx11::string::~string((string *)local_14b0);
    pMVar22 = (pGVar16->meshes).
              super__Vector_base<Assimp::RAWImporter::MeshInformation,_std::allocator<Assimp::RAWImporter::MeshInformation>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
LAB_00539f33:
    if ((int)lVar19 == 0xc) {
      s._0_8_ = data._0_8_;
      s.data._4_4_ = data[2];
      s.data[8] = '\0';
      s.data[9] = '\0';
      s.data[10] = -0x80;
      s.data[0xb] = '?';
      this_00 = &pMVar22->colors;
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                (this_00,(value_type *)&s);
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                (this_00,(value_type *)&s);
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                (this_00,(value_type *)&s);
      pvVar23 = &pMVar22->vertices;
      local_14b0._8_4_ = data[5];
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      emplace_back<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pvVar23,
                 (aiVector3t<float> *)local_14b0);
      local_14b0._0_4_ = data[6];
      local_14b0._4_4_ = data[7];
      local_14b0._8_4_ = data[8];
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      emplace_back<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pvVar23,
                 (aiVector3t<float> *)local_14b0);
      pScene = local_1518;
      local_14b0._0_4_ = data[9];
      local_14b0._4_4_ = data[10];
      local_14b0._8_4_ = data[0xb];
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      emplace_back<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pvVar23,
                 (aiVector3t<float> *)local_14b0);
    }
    else {
      pvVar23 = &pMVar22->vertices;
      s._0_8_ = data._0_8_;
      s.data._4_4_ = data[2];
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      emplace_back<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pvVar23,
                 (aiVector3t<float> *)&s);
      s.data._4_4_ = data[5];
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      emplace_back<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pvVar23,
                 (aiVector3t<float> *)&s);
      s._0_8_ = data._24_8_;
      s.data._4_4_ = data[8];
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      emplace_back<aiVector3t<float>>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)pvVar23,
                 (aiVector3t<float> *)&s);
    }
  } while( true );
}

Assistant:

void RAWImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL) {
        throw DeadlyImportError( "Failed to open RAW file " + pFile + ".");
    }

    // allocate storage and copy the contents of the file to a memory buffer
    // (terminate it with zero)
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    // list of groups loaded from the file
    std::vector< GroupInformation > outGroups(1,GroupInformation("<default>"));
    std::vector< GroupInformation >::iterator curGroup = outGroups.begin();

    // now read all lines
    char line[4096];
    while (GetNextLine(buffer,line))
    {
        // if the line starts with a non-numeric identifier, it marks
        // the beginning of a new group
        const char* sz = line;SkipSpaces(&sz);
        if (IsLineEnd(*sz))continue;
        if (!IsNumeric(*sz))
        {
            const char* sz2 = sz;
            while (!IsSpaceOrNewLine(*sz2))++sz2;
            const unsigned int length = (unsigned int)(sz2-sz);

            // find an existing group with this name
            for (std::vector< GroupInformation >::iterator it = outGroups.begin(), end = outGroups.end();
                it != end;++it)
            {
                if (length == (*it).name.length() && !::strcmp(sz,(*it).name.c_str()))
                {
                    curGroup = it;sz2 = NULL;
                    break;
                }
            }
            if (sz2)
            {
                outGroups.push_back(GroupInformation(std::string(sz,length)));
                curGroup = outGroups.end()-1;
            }
        }
        else
        {
            // there can be maximally 12 floats plus an extra texture file name
            float data[12];
            unsigned int num;
            for (num = 0; num < 12;++num)
            {
                if(!SkipSpaces(&sz) || !IsNumeric(*sz))break;
                sz = fast_atoreal_move<float>(sz,data[num]);
            }
            if (num != 12 && num != 9)
            {
                ASSIMP_LOG_ERROR("A line may have either 9 or 12 floats and an optional texture");
                continue;
            }

            MeshInformation* output = NULL;

            const char* sz2 = sz;
            unsigned int length;
            if (!IsLineEnd(*sz))
            {
                while (!IsSpaceOrNewLine(*sz2))++sz2;
                length = (unsigned int)(sz2-sz);
            }
            else if (9 == num)
            {
                sz = "%default%";
                length = 9;
            }
            else
            {
                sz = "";
                length = 0;
            }

            // search in the list of meshes whether we have one with this texture
            for (auto &mesh : (*curGroup).meshes)
            {
                if (length == mesh.name.length() && (length ? !::strcmp(sz, mesh.name.c_str()) : true))
                {
                    output = &mesh;
                    break;
                }
            }
            // if we don't have the mesh, create it
            if (!output)
            {
                (*curGroup).meshes.push_back(MeshInformation(std::string(sz,length)));
                output = &((*curGroup).meshes.back());
            }
            if (12 == num)
            {
                aiColor4D v(data[0],data[1],data[2],1.0f);
                output->colors.push_back(v);
                output->colors.push_back(v);
                output->colors.push_back(v);

                output->vertices.push_back(aiVector3D(data[3],data[4],data[5]));
                output->vertices.push_back(aiVector3D(data[6],data[7],data[8]));
                output->vertices.push_back(aiVector3D(data[9],data[10],data[11]));
            }
            else
            {
                output->vertices.push_back(aiVector3D(data[0],data[1],data[2]));
                output->vertices.push_back(aiVector3D(data[3],data[4],data[5]));
                output->vertices.push_back(aiVector3D(data[6],data[7],data[8]));
            }
        }
    }

    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<RawRoot>");

    // count the number of valid groups
    // (meshes can't be empty)
    for (auto & outGroup : outGroups)
    {
        if (!outGroup.meshes.empty())
        {
            ++pScene->mRootNode->mNumChildren;
            pScene->mNumMeshes += (unsigned int) outGroup.meshes.size();
        }
    }

    if (!pScene->mNumMeshes)
    {
        throw DeadlyImportError("RAW: No meshes loaded. The file seems to be corrupt or empty.");
    }

    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    aiNode** cc;
    if (1 == pScene->mRootNode->mNumChildren)
    {
        cc = &pScene->mRootNode;
        pScene->mRootNode->mNumChildren = 0;
    } else {
        cc = new aiNode*[pScene->mRootNode->mNumChildren];
        memset(cc, 0, sizeof(aiNode*) * pScene->mRootNode->mNumChildren);
        pScene->mRootNode->mChildren = cc;
    }

    pScene->mNumMaterials = pScene->mNumMeshes;
    aiMaterial** mats = pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];

    unsigned int meshIdx = 0;
    for (auto & outGroup : outGroups)
    {
        if (outGroup.meshes.empty())continue;

        aiNode* node;
        if (pScene->mRootNode->mNumChildren)
        {
            node = *cc = new aiNode();
            node->mParent = pScene->mRootNode;
        }
        else node = *cc;
        node->mName.Set(outGroup.name);

        // add all meshes
        node->mNumMeshes = (unsigned int) outGroup.meshes.size();
        unsigned int* pi = node->mMeshes = new unsigned int[ node->mNumMeshes ];
        for (std::vector< MeshInformation >::iterator it2 = outGroup.meshes.begin(),
            end2 = outGroup.meshes.end(); it2 != end2; ++it2)
        {
            ai_assert(!(*it2).vertices.empty());

            // allocate the mesh
            *pi++ = meshIdx;
            aiMesh* mesh = pScene->mMeshes[meshIdx] = new aiMesh();
            mesh->mMaterialIndex = meshIdx++;

            mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

            // allocate storage for the vertex components and copy them
            mesh->mNumVertices = (unsigned int)(*it2).vertices.size();
            mesh->mVertices = new aiVector3D[ mesh->mNumVertices ];
            ::memcpy(mesh->mVertices,&(*it2).vertices[0],sizeof(aiVector3D)*mesh->mNumVertices);

            if ((*it2).colors.size())
            {
                ai_assert((*it2).colors.size() == mesh->mNumVertices);

                mesh->mColors[0] = new aiColor4D[ mesh->mNumVertices ];
                ::memcpy(mesh->mColors[0],&(*it2).colors[0],sizeof(aiColor4D)*mesh->mNumVertices);
            }

            // generate triangles
            ai_assert(0 == mesh->mNumVertices % 3);
            aiFace* fc = mesh->mFaces = new aiFace[ mesh->mNumFaces = mesh->mNumVertices/3 ];
            aiFace* const fcEnd = fc + mesh->mNumFaces;
            unsigned int n = 0;
            while (fc != fcEnd)
            {
                aiFace& f = *fc++;
                f.mIndices = new unsigned int[f.mNumIndices = 3];
                for (unsigned int m = 0; m < 3;++m)
                    f.mIndices[m] = n++;
            }

            // generate a material for the mesh
            aiMaterial* mat = new aiMaterial();

            aiColor4D clr(1.0f,1.0f,1.0f,1.0f);
            if ("%default%" == (*it2).name) // a gray default material
            {
                clr.r = clr.g = clr.b = 0.6f;
            }
            else if ((*it2).name.length() > 0) // a texture
            {
                aiString s;
                s.Set((*it2).name);
                mat->AddProperty(&s,AI_MATKEY_TEXTURE_DIFFUSE(0));
            }
            mat->AddProperty<aiColor4D>(&clr,1,AI_MATKEY_COLOR_DIFFUSE);
            *mats++ = mat;
        }
    }
}